

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O2

bool __thiscall level_tools::check_paths(level_tools *this)

{
  bool status;
  bool local_11;
  
  local_11 = true;
  tools_base::check_path(&this->super_tools_base,xray_re::PA_SDK_ROOT,&local_11);
  tools_base::check_path(&this->super_tools_base,"$game_data$",&local_11);
  tools_base::check_path(&this->super_tools_base,"$game_config$",&local_11);
  tools_base::check_path(&this->super_tools_base,"$game_textures$",&local_11);
  tools_base::check_path(&this->super_tools_base,"$maps$",&local_11);
  tools_base::check_path(&this->super_tools_base,"$objects$",&local_11);
  return local_11;
}

Assistant:

bool level_tools::check_paths() const
{
	bool status = true;
	check_path(PA_SDK_ROOT, status);
	check_path(PA_GAME_DATA, status);
	check_path(PA_GAME_CONFIG, status);
	check_path(PA_GAME_TEXTURES, status);
	check_path(PA_MAPS, status);
	check_path(PA_OBJECTS, status);
	return status;
}